

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

float memory_tree_ns::return_reward_from_node
                (memory_tree *b,single_learner *base,uint32_t cn,example *ec,float weight)

{
  polylabel *ppVar1;
  polyprediction *ppVar2;
  example *peVar3;
  node *pnVar4;
  int64_t iVar5;
  float fVar6;
  labels preds;
  labels multilabels;
  float local_a0;
  label_t local_80;
  float *local_78;
  float *pfStack_70;
  float *local_68;
  size_t sStack_60;
  label_t local_58;
  wclass *pwStack_50;
  wclass *local_48;
  size_t sStack_40;
  
  ppVar1 = &ec->l;
  ppVar2 = &ec->pred;
  if (b->oas == 0) {
    local_80 = ppVar1->multi;
    local_a0 = ppVar2->scalar;
  }
  else {
    local_58 = ppVar1->multi;
    pwStack_50 = (ec->l).cs.costs._end;
    local_48 = (ec->l).cs.costs.end_array;
    sStack_40 = (ec->l).cs.costs.erase_count;
    local_78 = (ppVar2->scalars)._begin;
    pfStack_70 = (ec->pred).scalars._end;
    local_68 = (ec->pred).scalars.end_array;
    sStack_60 = (ec->pred).scalars.erase_count;
    local_a0 = 0.0;
  }
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar4 = (b->nodes)._begin;
  while (pnVar4[cn].internal != -1) {
    LEARNER::learner<char,_example>::predict(base,ec,(ulong)pnVar4[cn].base_router);
    pnVar4 = (b->nodes)._begin;
    cn = (&pnVar4[cn].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
  }
  if (b->oas == 0) {
    ppVar1->multi = local_80;
    ppVar2->scalar = local_a0;
  }
  else {
    (ec->pred).scalars.end_array = local_68;
    (ec->pred).scalars.erase_count = sStack_60;
    (ppVar2->scalars)._begin = local_78;
    (ec->pred).scalars._end = pfStack_70;
    (ec->l).cs.costs.end_array = local_48;
    (ec->l).cs.costs.erase_count = sStack_40;
    ppVar1->multi = local_58;
    (ec->l).cs.costs._end = pwStack_50;
  }
  iVar5 = pick_nearest(b,base,cn,ec);
  if (b->oas == 0) {
    local_a0 = 0.0;
    if ((iVar5 != -1) && (((b->examples)._begin[iVar5]->l).multi.label == (ppVar1->multi).label)) {
      local_a0 = 1.0;
    }
  }
  else if (iVar5 == -1) {
    local_a0 = 0.0;
  }
  else {
    local_a0 = F1_score_for_two_examples(ec,(b->examples)._begin[iVar5]);
  }
  b->total_num_queries = b->total_num_queries + 1;
  if ((iVar5 != -1) && (b->learn_at_leaf == 1)) {
    fVar6 = normalized_linear_prod(b,ec,(b->examples)._begin[iVar5]);
    diag_kronecker_product_test(ec,(b->examples)._begin[iVar5],b->kprod_ec,b->oas);
    peVar3 = b->kprod_ec;
    (peVar3->l).simple.label = local_a0;
    (peVar3->l).simple.weight = 1.0;
    (peVar3->l).simple.initial = -fVar6;
    b->kprod_ec->weight = weight;
    LEARNER::learner<char,_example>::learn(base,b->kprod_ec,b->max_routers);
  }
  if (b->oas == 1) {
    train_one_against_some_at_leaf(b,base,cn,ec);
  }
  return local_a0;
}

Assistant:

float return_reward_from_node(memory_tree& b, single_learner& base, uint32_t cn, example& ec, float weight = 1.f){
        //example& ec = *b.examples[ec_array_index];
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas ==false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }
	ec.l.simple = {FLT_MAX, 1., 0.0};
        while(b.nodes[cn].internal != -1){
            base.predict(ec, b.nodes[cn].base_router);
            float prediction = ec.pred.scalar;
            cn = prediction < 0 ? b.nodes[cn].left : b.nodes[cn].right;
        }
        
        if(b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }

        //get to leaf now:
	    int64_t closest_ec = 0;
        float reward = 0.f;
        closest_ec = pick_nearest(b, base, cn, ec); //no randomness for picking example.
        if (b.oas == false){
            if ((closest_ec != -1) && (b.examples[closest_ec]->l.multi.label == ec.l.multi.label))
                reward = 1.f;
        }
        else{
            if (closest_ec != -1)
                reward = F1_score_for_two_examples(ec, *b.examples[closest_ec]);
        }
        b.total_num_queries++;

        if (b.learn_at_leaf == true && closest_ec != -1){
        	float score = normalized_linear_prod(b, &ec, b.examples[closest_ec]);
            diag_kronecker_product_test(ec, *b.examples[closest_ec], *b.kprod_ec, b.oas );
         	b.kprod_ec->l.simple = {reward, 1.f, -score};
	    	b.kprod_ec->weight = weight;
            base.learn(*b.kprod_ec, b.max_routers);
        }

        if (b.oas == true)
            train_one_against_some_at_leaf(b,base, cn,ec); ///learn the inference procedure anyway

        return reward;
    }